

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * local_store_declaration
                    (gravity_parser_t *parser,char *identifier,char *annotation_type,
                    gtoken_t access_specifier,gtoken_t storage_specifier,gnode_t *declaration)

{
  gnode_r *declarations;
  gnode_variable_decl_t *vdecl;
  char *identifier_00;
  gnode_t *pgVar1;
  gnode_t **ppgVar2;
  size_t sVar3;
  size_t sVar4;
  
  declarations = gnode_array_create();
  sVar3 = parser->declarations->n;
  if (sVar3 == 0) {
    pgVar1 = (gnode_t *)0x0;
  }
  else {
    pgVar1 = parser->declarations->p[sVar3 - 1];
  }
  vdecl = (gnode_variable_decl_t *)
          gnode_variable_decl_create
                    (declaration->token,TOK_KEY_VAR,access_specifier,storage_specifier,declarations,
                     pgVar1);
  if (identifier == (char *)0x0) {
    identifier_00 = (char *)0x0;
  }
  else {
    identifier_00 = string_dup(identifier);
  }
  sVar3 = parser->declarations->n;
  if (sVar3 == 0) {
    pgVar1 = (gnode_t *)0x0;
  }
  else {
    pgVar1 = parser->declarations->p[sVar3 - 1];
  }
  pgVar1 = gnode_variable_create
                     (declaration->token,identifier_00,annotation_type,declaration,pgVar1,vdecl);
  sVar3 = declarations->n;
  if (sVar3 == declarations->m) {
    sVar4 = 8;
    if (sVar3 != 0) {
      sVar4 = sVar3 * 2;
    }
    declarations->m = sVar4;
    ppgVar2 = (gnode_t **)realloc(declarations->p,sVar4 << 3);
    declarations->p = ppgVar2;
    sVar3 = declarations->n;
  }
  else {
    ppgVar2 = declarations->p;
  }
  declarations->n = sVar3 + 1;
  ppgVar2[sVar3] = pgVar1;
  return &vdecl->base;
}

Assistant:

static gnode_t *local_store_declaration (gravity_parser_t *parser, const char *identifier, const char *annotation_type, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_t *declaration) {
    gnode_r *decls = gnode_array_create();
    
    gnode_variable_decl_t *vdecl = (gnode_variable_decl_t *)gnode_variable_decl_create(declaration->token, TOK_KEY_VAR, access_specifier, storage_specifier, decls, LAST_DECLARATION());
    gnode_t *decl = gnode_variable_create(declaration->token, identifier ? string_dup(identifier) : NULL, annotation_type, declaration, LAST_DECLARATION(), vdecl);
    gnode_array_push(decls, decl);
    
    return (gnode_t *)vdecl;
}